

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *pNew,Abc_Ntk_t *pNtk,int *pCounter,Vec_Int_t *vBufs)

{
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pModel;
  int local_48;
  int iBufStart;
  int k;
  int i;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vDfs;
  Vec_Int_t *vBufs_local;
  int *pCounter_local;
  Abc_Ntk_t *pNtk_local;
  Gia_Man_t *pNew_local;
  
  p = (Vec_Ptr_t *)pNtk->pData;
  *pCounter = *pCounter + 1;
  iBufStart = 0;
  do {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= iBufStart) {
      return;
    }
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iBufStart);
    iVar1 = Abc_ObjIsNode(pAVar4);
    if (iVar1 == 0) {
      iVar1 = Gia_ManBufNum(pNew);
      pNtk_00 = *(Abc_Ntk_t **)&(pAVar4->field_5).iData;
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 != 0) {
        __assert_fail("!Abc_ObjIsLatch(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,0x67,
                      "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                     );
      }
      iVar2 = Abc_NtkPiNum(pNtk_00);
      iVar3 = Abc_ObjFaninNum(pAVar4);
      if (iVar2 != iVar3) {
        __assert_fail("Abc_NtkPiNum(pModel) == Abc_ObjFaninNum(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,0x68,
                      "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                     );
      }
      iVar2 = Abc_NtkPoNum(pNtk_00);
      iVar3 = Abc_ObjFanoutNum(pAVar4);
      if (iVar2 != iVar3) {
        __assert_fail("Abc_NtkPoNum(pModel) == Abc_ObjFanoutNum(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,0x69,
                      "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                     );
      }
      Abc_NtkFillTemp(pNtk_00);
      for (local_48 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_48 < iVar2; local_48 = local_48 + 1)
      {
        pAVar5 = Abc_ObjFanin(pAVar4,local_48);
        pAVar6 = Abc_ObjFanin0(pAVar5);
        iVar2 = Abc_ObjIsNet(pAVar6);
        if (iVar2 == 0) {
          __assert_fail("Abc_ObjIsNet(Abc_ObjFanin0(pTerm))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                        ,0x6d,
                        "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                       );
        }
        pAVar5 = Abc_ObjFanin0(pAVar5);
        iVar2 = (pAVar5->field_6).iTemp;
        pAVar5 = Abc_NtkPi(pNtk_00,local_48);
        pAVar5 = Abc_ObjFanout0(pAVar5);
        (pAVar5->field_6).iTemp = iVar2;
      }
      if (vBufs != (Vec_Int_t *)0x0) {
        for (local_48 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_48 < iVar2;
            local_48 = local_48 + 1) {
          Abc_ObjFanin(pAVar4,local_48);
          pAVar5 = Abc_NtkPi(pNtk_00,local_48);
          pAVar5 = Abc_ObjFanout0(pAVar5);
          iVar2 = Gia_ManAppendBuf(pNew,(pAVar5->field_6).iTemp);
          pAVar5 = Abc_NtkPi(pNtk_00,local_48);
          pAVar5 = Abc_ObjFanout0(pAVar5);
          (pAVar5->field_6).iTemp = iVar2;
        }
      }
      Abc_NtkFlattenHierarchyGia2_rec(pNew,pNtk_00,pCounter,vBufs);
      if (vBufs != (Vec_Int_t *)0x0) {
        for (local_48 = 0; iVar2 = Abc_ObjFanoutNum(pAVar4), local_48 < iVar2;
            local_48 = local_48 + 1) {
          Abc_ObjFanout(pAVar4,local_48);
          pAVar5 = Abc_NtkPo(pNtk_00,local_48);
          pAVar5 = Abc_ObjFanin0(pAVar5);
          iVar2 = Gia_ManAppendBuf(pNew,(pAVar5->field_6).iTemp);
          pAVar5 = Abc_NtkPo(pNtk_00,local_48);
          pAVar5 = Abc_ObjFanin0(pAVar5);
          (pAVar5->field_6).iTemp = iVar2;
        }
      }
      for (local_48 = 0; iVar2 = Abc_ObjFanoutNum(pAVar4), local_48 < iVar2; local_48 = local_48 + 1
          ) {
        pAVar5 = Abc_ObjFanout(pAVar4,local_48);
        pAVar6 = Abc_ObjFanout0(pAVar5);
        iVar2 = Abc_ObjIsNet(pAVar6);
        if (iVar2 == 0) {
          __assert_fail("Abc_ObjIsNet(Abc_ObjFanout0(pTerm))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                        ,0x79,
                        "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                       );
        }
        pAVar6 = Abc_NtkPo(pNtk_00,local_48);
        pAVar6 = Abc_ObjFanin0(pAVar6);
        iVar2 = (pAVar6->field_6).iTemp;
        pAVar5 = Abc_ObjFanout0(pAVar5);
        (pAVar5->field_6).iTemp = iVar2;
      }
      if (vBufs != (Vec_Int_t *)0x0) {
        Vec_IntPush(vBufs,iVar1);
        iVar1 = Abc_NtkPiNum(pNtk_00);
        Vec_IntPush(vBufs,iVar1);
        iVar1 = Gia_ManBufNum(pNew);
        iVar2 = Abc_NtkPoNum(pNtk_00);
        Vec_IntPush(vBufs,iVar1 - iVar2);
        iVar1 = Abc_NtkPoNum(pNtk_00);
        Vec_IntPush(vBufs,iVar1);
      }
    }
    else {
      iVar1 = Abc_NodeStrashToGia(pNew,pAVar4);
      pAVar4 = Abc_ObjFanout0(pAVar4);
      (pAVar4->field_6).iTemp = iVar1;
    }
    iBufStart = iBufStart + 1;
  } while( true );
}

Assistant:

void Abc_NtkFlattenHierarchyGia2_rec( Gia_Man_t * pNew, Abc_Ntk_t * pNtk, int * pCounter, Vec_Int_t * vBufs )
{
    Vec_Ptr_t * vDfs = (Vec_Ptr_t *)pNtk->pData;
    Abc_Obj_t * pObj, * pTerm; 
    int i, k; (*pCounter)++;
    //printf( "[%d:%d] ", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vDfs, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
            Abc_ObjFanout0(pObj)->iTemp = Abc_NodeStrashToGia( pNew, pObj );
        else
        {
            int iBufStart = Gia_ManBufNum(pNew);
            Abc_Ntk_t * pModel = (Abc_Ntk_t *)pObj->pData;
            assert( !Abc_ObjIsLatch(pObj) );
            assert( Abc_NtkPiNum(pModel) == Abc_ObjFaninNum(pObj) );
            assert( Abc_NtkPoNum(pModel) == Abc_ObjFanoutNum(pObj) );
            Abc_NtkFillTemp( pModel );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                assert( Abc_ObjIsNet(Abc_ObjFanin0(pTerm)) );
                Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
            }
            if ( vBufs )
                Abc_ObjForEachFanin( pObj, pTerm, k )
                    Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp = Gia_ManAppendBuf( pNew, Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp );
            Abc_NtkFlattenHierarchyGia2_rec( pNew, pModel, pCounter, vBufs );
            if ( vBufs )
                Abc_ObjForEachFanout( pObj, pTerm, k )
                    Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp = Gia_ManAppendBuf( pNew, Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp );
            Abc_ObjForEachFanout( pObj, pTerm, k )
            {
                assert( Abc_ObjIsNet(Abc_ObjFanout0(pTerm)) );
                Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp;
            }
            // save buffers
            if ( vBufs == NULL )
                continue;
            Vec_IntPush( vBufs, iBufStart );
            Vec_IntPush( vBufs, Abc_NtkPiNum(pModel) );
            Vec_IntPush( vBufs, Gia_ManBufNum(pNew) - Abc_NtkPoNum(pModel) );
            Vec_IntPush( vBufs, Abc_NtkPoNum(pModel) );
        }
    }
}